

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessUNIX.c
# Opt level: O0

kwsysProcessTime kwsysProcessTimeGetCurrent(void)

{
  kwsysProcessTime kVar1;
  undefined1 local_38 [8];
  timespec current_timespec;
  kwsysProcessTimeNative current_native;
  kwsysProcessTime current;
  
  clock_gettime(1,(timespec *)local_38);
  kVar1.tv_usec = current_timespec.tv_sec / 1000;
  kVar1.tv_sec = (long)local_38;
  return kVar1;
}

Assistant:

static kwsysProcessTime kwsysProcessTimeGetCurrent(void)
{
  kwsysProcessTime current;
  kwsysProcessTimeNative current_native;
#if KWSYS_C_HAS_CLOCK_GETTIME_MONOTONIC
  struct timespec current_timespec;
  clock_gettime(CLOCK_MONOTONIC, &current_timespec);

  current_native.tv_sec = current_timespec.tv_sec;
  current_native.tv_usec = current_timespec.tv_nsec / 1000;
#else
  gettimeofday(&current_native, 0);
#endif
  current.tv_sec = (long)current_native.tv_sec;
  current.tv_usec = (long)current_native.tv_usec;
  return current;
}